

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O3

bool __thiscall cmCTestRunTest::NeedsToRepeat(cmCTestRunTest *this)

{
  int *piVar1;
  int iVar2;
  
  piVar1 = &this->NumberOfRunsLeft;
  *piVar1 = *piVar1 + -1;
  if (((*piVar1 != 0) && (iVar2 = (this->TestResult).Status, iVar2 != 0)) &&
     ((this->RepeatMode == (iVar2 != 9) + UntilFail ||
      (iVar2 == 1 && this->RepeatMode == AfterTimeout)))) {
    this->RunAgain = true;
    return true;
  }
  return false;
}

Assistant:

bool cmCTestRunTest::NeedsToRepeat()
{
  this->NumberOfRunsLeft--;
  if (this->NumberOfRunsLeft == 0) {
    return false;
  }
  // If a test is marked as NOT_RUN it will not be repeated
  // no matter the repeat settings, so just record it as-is.
  if (this->TestResult.Status == cmCTestTestHandler::NOT_RUN) {
    return false;
  }
  // if number of runs left is not 0, and we are running until
  // we find a failed (or passed) test, then return true so the test can be
  // restarted
  if ((this->RepeatMode == cmCTest::Repeat::UntilFail &&
       this->TestResult.Status == cmCTestTestHandler::COMPLETED) ||
      (this->RepeatMode == cmCTest::Repeat::UntilPass &&
       this->TestResult.Status != cmCTestTestHandler::COMPLETED) ||
      (this->RepeatMode == cmCTest::Repeat::AfterTimeout &&
       this->TestResult.Status == cmCTestTestHandler::TIMEOUT)) {
    this->RunAgain = true;
    return true;
  }
  return false;
}